

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int __thiscall glslang::TIntermediate::addXfbBufferOffset(TIntermediate *this,TType *type)

{
  pointer *ppTVar1;
  bool *contains16BitType;
  iterator __position;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  TRange *pTVar8;
  long lVar9;
  pointer pTVar10;
  TRange range;
  TRange local_38;
  
  iVar2 = (*type->_vptr_TType[0xb])(type);
  lVar9 = CONCAT44(extraout_var,iVar2);
  uVar6 = (uint)*(undefined8 *)(lVar9 + 0x24);
  if (((~uVar6 & 0x7ffc0000) == 0) || (uVar4 = (ulong)(uVar6 & 0xf), uVar4 == 0xf)) {
    __assert_fail("qualifier.hasXfbOffset() && qualifier.hasXfbBuffer()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                  ,0x80a,"int glslang::TIntermediate::addXfbBufferOffset(const TType &)");
  }
  pTVar10 = (this->xfbBuffers).
            super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
            super__Vector_impl_data._M_start;
  contains16BitType = &pTVar10[uVar4].contains16BitType;
  uVar3 = computeTypeXfbSize(this,type,&pTVar10[uVar4].contains64BitType,
                             &pTVar10[uVar4].contains32BitType,contains16BitType);
  uVar6 = (*(uint *)(lVar9 + 0x24) >> 0x12 & 0x1fff) + uVar3;
  if (uVar6 < *(uint *)(contains16BitType + -6)) {
    uVar6 = *(uint *)(contains16BitType + -6);
  }
  *(uint *)(contains16BitType + -6) = uVar6;
  uVar6 = *(uint *)(lVar9 + 0x24) >> 0x12;
  uVar7 = uVar6 & 0x1fff;
  iVar2 = uVar3 + uVar7 + -1;
  local_38 = (TRange)(CONCAT44(iVar2,uVar6) & 0xffffffff00001fff);
  piVar5 = *(int **)&(((TXfbBuffer *)(contains16BitType + -0x22))->ranges).
                     super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl;
  __position._M_current = *(TRange **)(contains16BitType + -0x1a);
  if ((long)__position._M_current - (long)piVar5 != 0) {
    lVar9 = (long)__position._M_current - (long)piVar5 >> 3;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    do {
      if ((*piVar5 <= iVar2) && ((int)uVar7 <= piVar5[1])) {
        pTVar8 = &local_38;
        if ((int)uVar7 < *piVar5) {
          pTVar8 = (TRange *)piVar5;
        }
        return pTVar8->start;
      }
      piVar5 = piVar5 + 2;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  pTVar10 = pTVar10 + uVar4;
  if (__position._M_current ==
      (pTVar10->ranges).super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glslang::TRange,std::allocator<glslang::TRange>>::
    _M_realloc_insert<glslang::TRange_const&>
              ((vector<glslang::TRange,std::allocator<glslang::TRange>> *)pTVar10,__position,
               &local_38);
  }
  else {
    *__position._M_current = local_38;
    ppTVar1 = &(pTVar10->ranges).
               super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return -1;
}

Assistant:

int TIntermediate::addXfbBufferOffset(const TType& type)
{
    const TQualifier& qualifier = type.getQualifier();

    assert(qualifier.hasXfbOffset() && qualifier.hasXfbBuffer());
    TXfbBuffer& buffer = xfbBuffers[qualifier.layoutXfbBuffer];

    // compute the range
    unsigned int size = computeTypeXfbSize(type, buffer.contains64BitType, buffer.contains32BitType, buffer.contains16BitType);
    buffer.implicitStride = std::max(buffer.implicitStride, qualifier.layoutXfbOffset + size);
    TRange range(qualifier.layoutXfbOffset, qualifier.layoutXfbOffset + size - 1);

    // check for collisions
    for (size_t r = 0; r < buffer.ranges.size(); ++r) {
        if (range.overlap(buffer.ranges[r])) {
            // there is a collision; pick an example to return
            return std::max(range.start, buffer.ranges[r].start);
        }
    }

    buffer.ranges.push_back(range);

    return -1;  // no collision
}